

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

void nni_device(nni_aio *aio,nni_sock *s1,nni_sock *s2)

{
  int *piVar1;
  nni_sock *sock;
  bool bVar2;
  _Bool _Var3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  nni_sock *pnVar7;
  nni_sock *pnVar8;
  nni_aio *pnVar9;
  nni_sock *sock_00;
  uint uVar10;
  nng_err result;
  ulong uVar11;
  long lVar12;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&device_mtx);
  pnVar8 = s1;
  if (s1 == (nni_sock *)0x0) {
    pnVar8 = s2;
  }
  if (s2 == (nni_sock *)0x0) {
    s2 = s1;
  }
  result = NNG_EINVAL;
  if (s2 != (nni_sock *)0x0 && pnVar8 != (nni_sock *)0x0) {
    uVar4 = nni_sock_peer_id(pnVar8);
    uVar5 = nni_sock_proto_id(s2);
    if (uVar4 == uVar5) {
      uVar4 = nni_sock_peer_id(s2);
      uVar5 = nni_sock_proto_id(pnVar8);
      if (((uVar4 == uVar5) && (_Var3 = nni_sock_raw(pnVar8), _Var3)) &&
         (_Var3 = nni_sock_raw(s2), _Var3)) {
        uVar6 = nni_sock_flags(pnVar8);
        sock_00 = pnVar8;
        sock = s2;
        if ((uVar6 & 1) == 0) {
          sock_00 = s2;
          sock = pnVar8;
        }
        uVar6 = nni_sock_flags(sock_00);
        if ((uVar6 & 1) == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/device.c"
                    ,0xaa,"(nni_sock_flags(s1) & NNI_PROTO_FLAG_RCV) != 0");
        }
        uVar6 = nni_sock_flags(sock);
        result = NNG_ENOMEM;
        pnVar7 = (nni_sock *)nni_zalloc(0x3f0);
        if (pnVar7 == (nni_sock *)0x0) {
          bVar2 = false;
        }
        else {
          uVar10 = 2 - (s2 == pnVar8 || (uVar6 & 1) == 0);
          *(undefined4 *)&(pnVar7->s_node).ln_prev = 0;
          pnVar9 = (nni_aio *)&pnVar7->s_cv;
          uVar11 = 0;
          do {
            pnVar8 = sock;
            if (uVar11 == 0) {
              pnVar8 = sock_00;
            }
            pnVar9[-1].a_expire_node.ln_prev = &pnVar8->s_node;
            pnVar8 = sock_00;
            if (uVar11 == 0) {
              pnVar8 = sock;
            }
            pnVar9[-1].a_reap_node.rn_next = (nni_reap_node *)pnVar8;
            pnVar9[-1].a_expire_node.ln_next = (nni_list_node *)pnVar7;
            *(undefined4 *)&pnVar9[-1].a_expire_q = 0;
            nni_aio_init(pnVar9,device_cb,&pnVar9[-1].a_expire_q);
            nni_aio_set_timeout(pnVar9,-1);
            uVar11 = uVar11 + 1;
            pnVar9 = (nni_aio *)&pnVar9[1].a_task;
          } while (uVar10 != uVar11);
          nni_sock_hold((nni_sock *)(pnVar7->s_mx).mtx.__data.__list.__prev);
          nni_sock_hold((nni_sock *)(pnVar7->s_mx).mtx.__data.__list.__next);
          *(uint *)&(pnVar7->s_node).ln_prev = uVar10;
          result = NNG_OK;
          bVar2 = true;
          s2 = pnVar7;
        }
        goto LAB_00111234;
      }
    }
  }
  bVar2 = false;
LAB_00111234:
  if (bVar2) {
    _Var3 = nni_aio_start(aio,device_cancel,s2);
    if (!_Var3) {
      nni_mtx_unlock(&device_mtx);
      nni_reap(&device_reap,s2);
    }
    (s2->s_node).ln_next = (nni_list_node *)aio;
    if (0 < *(int *)&(s2->s_node).ln_prev) {
      pnVar9 = (nni_aio *)&s2->s_cv;
      lVar12 = 0;
      do {
        *(undefined4 *)&pnVar9[-1].a_expire_q = 1;
        nni_sock_recv((nni_sock *)pnVar9[-1].a_expire_node.ln_prev,pnVar9);
        piVar1 = (int *)((long)&(s2->s_node).ln_prev + 4);
        *piVar1 = *piVar1 + 1;
        lVar12 = lVar12 + 1;
        pnVar9 = (nni_aio *)&pnVar9[1].a_task;
      } while (lVar12 < *(int *)&(s2->s_node).ln_prev);
    }
    nni_mtx_unlock(&device_mtx);
    return;
  }
  nni_mtx_unlock(&device_mtx);
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

void
nni_device(nni_aio *aio, nni_sock *s1, nni_sock *s2)
{
	device_data *d;
	int          rv;

	nni_aio_reset(aio);
	nni_mtx_lock(&device_mtx);
	if ((rv = device_init(&d, s1, s2)) != 0) {
		nni_mtx_unlock(&device_mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (!nni_aio_start(aio, device_cancel, d)) {
		nni_mtx_unlock(&device_mtx);
		nni_reap(&device_reap, d);
	}
	device_start(d, aio);
	nni_mtx_unlock(&device_mtx);
}